

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

QByteArray * __thiscall Parser::lexem(QByteArray *__return_storage_ptr__,Parser *this)

{
  QByteArray::mid((longlong)__return_storage_ptr__,
                  (longlong)&(this->symbols).d.ptr[this->index + -1].lex);
  return __return_storage_ptr__;
}

Assistant:

inline QByteArray lexem() { return symbols.at(index-1).lexem();}